

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

int container_rank(container_t *c,uint8_t type,uint16_t x)

{
  uint16_t x_00;
  int iVar1;
  run_container_t *container;
  uint16_t in_DX;
  uint8_t in_SIL;
  container_t *in_RDI;
  bitset_container_t *in_stack_00000010;
  uint8_t local_11 [7];
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_11[0] = in_SIL;
  container = (run_container_t *)container_unwrap_shared(in_RDI,local_11);
  unique0x100000b1 = container;
  if (local_11[0] == '\x01') {
    iVar1 = bitset_container_rank(in_stack_00000010,c._6_2_);
  }
  else if (local_11[0] == '\x02') {
    x_00 = (uint16_t)((ulong)container >> 0x30);
    iVar1 = array_container_rank
                      ((array_container_t *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),x_00);
  }
  else {
    iVar1 = run_container_rank(container,in_DX);
  }
  return iVar1;
}

Assistant:

static inline int container_rank(const container_t *c, uint8_t type,
                                 uint16_t x) {
    c = container_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_rank(const_CAST_bitset(c), x);
        case ARRAY_CONTAINER_TYPE:
            return array_container_rank(const_CAST_array(c), x);
        case RUN_CONTAINER_TYPE:
            return run_container_rank(const_CAST_run(c), x);
        default:
            assert(false);
            roaring_unreachable;
    }
    assert(false);
    roaring_unreachable;
    return false;
}